

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::CFGNode::branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,CFGNode *this,string *next,string *target,
          shared_ptr<vmips::VirtReg> *args,shared_ptr<vmips::VirtReg> *args_1)

{
  shared_ptr<vmips::CFGNode> b;
  shared_ptr<vmips::CFGNode> a;
  shared_ptr<vmips::ble> instr;
  shared_ptr<vmips::Instruction> sStack_68;
  __shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<vmips::ble,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<vmips::CFGNode,vmips::Function*&,std::__cxx11::string&>
            ((Function **)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::make_shared<vmips::CFGNode,vmips::Function*&,std::__cxx11::string&>
            ((Function **)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::
  make_shared<vmips::ble,std::shared_ptr<vmips::CFGNode>&,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            ((shared_ptr<vmips::CFGNode> *)&local_38,(shared_ptr<vmips::VirtReg> *)&local_58,args);
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<vmips::ble,void>
            ((__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> *)&sStack_68,&local_38);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(this + 0x30),&sStack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_68.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::CFGNode,void>
            ((__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2> *)&sStack_68,&local_48);
  std::vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>>::
  emplace_back<std::weak_ptr<vmips::CFGNode>>
            ((vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>> *)
             (this + 0x48),(weak_ptr<vmips::CFGNode> *)&sStack_68);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &sStack_68.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::CFGNode,void>
            ((__weak_ptr<vmips::CFGNode,(__gnu_cxx::_Lock_policy)2> *)&sStack_68,&local_58);
  std::vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>>::
  emplace_back<std::weak_ptr<vmips::CFGNode>>
            ((vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>> *)
             (this + 0x48),(weak_ptr<vmips::CFGNode> *)&sStack_68);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &sStack_68.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::
  pair<std::shared_ptr<vmips::CFGNode>_&,_std::shared_ptr<vmips::CFGNode>_&,_true>
            (__return_storage_ptr__,(shared_ptr<vmips::CFGNode> *)&local_48,
             (shared_ptr<vmips::CFGNode> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>>
        branch(std::string next, std::string target, Args &&... args) {
            auto a = std::make_shared<CFGNode>(function, next);
            auto b = std::make_shared<CFGNode>(function, target);
            auto instr = std::make_shared<Instr>(b, std::forward<Args>(args)...);
            instructions.push_back(instr);
            out_edges.push_back(a);
            out_edges.push_back(b);
            return {a, b};
        }